

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkCore.c
# Opt level: O1

int Lpk_ResynthesizeNodeNew(Lpk_Man_t *p)

{
  int *piVar1;
  Vec_Ptr_t *pVVar2;
  void *pvVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  undefined4 extraout_var;
  void **ppvVar8;
  uint *pTruth;
  Vec_Ptr_t *pVVar9;
  Abc_Obj_t *pObjNew;
  ulong uVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  uint uVar14;
  Lpk_Cut_t *pCut;
  timespec ts;
  
  iVar4 = Abc_ObjRequiredLevel(p->pObj);
  iVar5 = clock_gettime(3,(timespec *)&ts);
  if (iVar5 < 0) {
    lVar11 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
    lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + ts.tv_sec * -1000000;
  }
  iVar5 = Lpk_NodeCuts(p);
  if (iVar5 == 0) {
    iVar4 = clock_gettime(3,(timespec *)&ts);
    if (iVar4 < 0) {
      lVar12 = -1;
    }
    else {
      lVar12 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    p->timeCuts = p->timeCuts + lVar12 + lVar11;
    iVar5 = 0;
  }
  else {
    iVar5 = clock_gettime(3,(timespec *)&ts);
    if (iVar5 < 0) {
      lVar12 = -1;
    }
    else {
      lVar12 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    p->timeCuts = p->timeCuts + lVar12 + lVar11;
    if (p->pPars->fVeryVerbose != 0) {
      printf("Node %5d : Mffc size = %5d. Cuts = %5d.  Level = %2d. Req = %2d.\n",
             (ulong)(uint)p->pObj->Id,(ulong)(uint)p->nMffc,(ulong)(uint)p->nEvals,
             (ulong)(*(uint *)&p->pObj->field_0x14 >> 0xc),CONCAT44(extraout_var,iVar4));
    }
    p->nCutsTotal = p->nCutsTotal + p->nCuts;
    p->nCutsUseful = p->nCutsUseful + p->nEvals;
    iVar5 = 1;
    if (0 < p->nEvals) {
      lVar11 = 0;
      do {
        if ((lVar11 == 1) && (p->pPars->fFirst != 0)) break;
        pCut = p->pCuts + p->pEvals[lVar11];
        if ((undefined1  [212])((undefined1  [212])*pCut & (undefined1  [212])0x3f) !=
            (undefined1  [212])0x0) {
          pVVar9 = p->pNtk->vObjs;
          uVar10 = 0;
          do {
            iVar5 = pCut->pLeaves[uVar10];
            if (((long)iVar5 < 0) || (pVVar9->nSize <= iVar5)) goto LAB_0046afbf;
            piVar1 = (int *)((long)pVVar9->pArray[iVar5] + 0x2c);
            *piVar1 = *piVar1 + 1;
            uVar10 = uVar10 + 1;
          } while (uVar10 < (*(uint *)pCut & 0x3f));
        }
        iVar5 = Abc_NodeMffcLabel(p->pObj);
        uVar14 = *(uint *)pCut;
        if ((uVar14 & 0x3f) != 0) {
          pVVar9 = p->pNtk->vObjs;
          uVar10 = 0;
          do {
            iVar7 = pCut->pLeaves[uVar10];
            if (((long)iVar7 < 0) || (pVVar9->nSize <= iVar7)) goto LAB_0046afbf;
            piVar1 = (int *)((long)pVVar9->pArray[iVar7] + 0x2c);
            *piVar1 = *piVar1 + -1;
            uVar10 = uVar10 + 1;
            uVar14 = *(uint *)pCut;
          } while (uVar10 < (uVar14 & 0x3f));
        }
        if (iVar5 == (uVar14 >> 6 & 0x3f) - (uVar14 >> 0xc & 0x3f)) {
          p->vLeaves->nSize = 0;
          if ((undefined1  [212])((undefined1  [212])*pCut & (undefined1  [212])0x3f) !=
              (undefined1  [212])0x0) {
            uVar10 = 0;
            do {
              iVar5 = pCut->pLeaves[uVar10];
              if (((long)iVar5 < 0) || (pVVar9 = p->pNtk->vObjs, pVVar9->nSize <= iVar5)) {
LAB_0046afbf:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              pVVar2 = p->vLeaves;
              pvVar3 = pVVar9->pArray[iVar5];
              uVar14 = pVVar2->nCap;
              if (pVVar2->nSize == uVar14) {
                if ((int)uVar14 < 0x10) {
                  if (pVVar2->pArray == (void **)0x0) {
                    ppvVar8 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar8 = (void **)realloc(pVVar2->pArray,0x80);
                  }
                  pVVar2->pArray = ppvVar8;
                  iVar5 = 0x10;
                }
                else {
                  iVar5 = uVar14 * 2;
                  if (iVar5 <= (int)uVar14) goto LAB_0046abd2;
                  if (pVVar2->pArray == (void **)0x0) {
                    ppvVar8 = (void **)malloc((ulong)uVar14 << 4);
                  }
                  else {
                    ppvVar8 = (void **)realloc(pVVar2->pArray,(ulong)uVar14 << 4);
                  }
                  pVVar2->pArray = ppvVar8;
                }
                pVVar2->nCap = iVar5;
              }
LAB_0046abd2:
              iVar5 = pVVar2->nSize;
              pVVar2->nSize = iVar5 + 1;
              pVVar2->pArray[iVar5] = pvVar3;
              uVar10 = uVar10 + 1;
            } while (uVar10 < (*(uint *)pCut & 0x3f));
          }
          iVar5 = clock_gettime(3,(timespec *)&ts);
          if (iVar5 < 0) {
            lVar12 = 1;
          }
          else {
            lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
            lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + ts.tv_sec * -1000000;
          }
          pTruth = Lpk_CutTruth(p,pCut,0);
          iVar5 = clock_gettime(3,(timespec *)&ts);
          if (iVar5 < 0) {
            lVar13 = -1;
          }
          else {
            lVar13 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          p->timeTruth = p->timeTruth + lVar13 + lVar12;
          iVar5 = clock_gettime(3,(timespec *)&ts);
          if (iVar5 < 0) {
            lVar12 = 1;
          }
          else {
            lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
            lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + ts.tv_sec * -1000000;
          }
          Lpk_ComputeSupports(p,pCut,pTruth);
          iVar5 = clock_gettime(3,(timespec *)&ts);
          if (iVar5 < 0) {
            lVar13 = -1;
          }
          else {
            lVar13 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          p->timeSupps = p->timeSupps + lVar13 + lVar12;
          if (p->pPars->fVeryVerbose != 0) {
            uVar6 = Extra_TruthSupportSize(pTruth,*(uint *)pCut & 0x3f);
            uVar14 = *(uint *)pCut;
            printf("  C%02d: L= %2d/%2d  V= %2d/%d  N= %d  W= %4.2f  ",(double)pCut->Weight,lVar11,
                   (ulong)(uVar14 & 0x3f),(ulong)uVar6,(ulong)(uVar14 >> 6 & 0x3f),
                   (ulong)(uVar14 >> 0xc & 0x3f),(ulong)(uVar14 >> 0x12 & 0x3f));
            pVVar9 = p->vLeaves;
            if (0 < pVVar9->nSize) {
              lVar12 = 0;
              do {
                printf("%c=%d ",(ulong)((int)lVar12 + 0x61),
                       (ulong)(*(uint *)((long)pVVar9->pArray[lVar12] + 0x14) >> 0xc));
                lVar12 = lVar12 + 1;
                pVVar9 = p->vLeaves;
              } while (lVar12 < pVVar9->nSize);
            }
            putchar(10);
            Kit_DsdPrintFromTruth(pTruth,*(uint *)pCut & 0x3f);
          }
          iVar5 = p->pNtk->nObjCounts[7];
          iVar7 = clock_gettime(3,(timespec *)&ts);
          if (iVar7 < 0) {
            lVar12 = 1;
          }
          else {
            lVar12 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(ts.tv_nsec),8);
            lVar12 = ((lVar12 >> 7) - (lVar12 >> 0x3f)) + ts.tv_sec * -1000000;
          }
          pObjNew = Lpk_Decompose(p,p->pNtk,p->vLeaves,pTruth,p->puSupps,p->pPars->nLutSize,
                                  (uint)(0 < p->pPars->fZeroCost) +
                                  (~*(uint *)pCut >> 0xc | 0xffffffc0) + (*(uint *)pCut >> 6 & 0x3f)
                                  ,iVar4);
          iVar7 = clock_gettime(3,(timespec *)&ts);
          if (iVar7 < 0) {
            lVar13 = -1;
          }
          else {
            lVar13 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
          }
          p->timeEval = p->timeEval + lVar13 + lVar12;
          if (pObjNew != (Abc_Obj_t *)0x0) {
            uVar14 = (iVar5 - p->pNtk->nObjCounts[7]) +
                     ((*(uint *)pCut >> 6 & 0x3f) - (*(uint *)pCut >> 0xc & 0x3f));
            if ((int)uVar14 < 1 - p->pPars->fZeroCost) {
              __assert_fail("nGain >= 1 - p->pPars->fZeroCost",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCore.c"
                            ,0x1d6,"int Lpk_ResynthesizeNodeNew(Lpk_Man_t *)");
            }
            if (iVar4 < (int)(*(uint *)&pObjNew->field_0x14 >> 0xc)) {
              __assert_fail("Abc_ObjLevel(pObjNew) <= Required",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/lpk/lpkCore.c"
                            ,0x1d7,"int Lpk_ResynthesizeNodeNew(Lpk_Man_t *)");
            }
            p->nGainTotal = p->nGainTotal + uVar14;
            p->nChanges = p->nChanges + 1;
            if (p->pPars->fVeryVerbose != 0) {
              printf("Performed resynthesis: Gain = %2d. Level = %2d. Req = %2d.\n",(ulong)uVar14,
                     (ulong)(*(uint *)&pObjNew->field_0x14 >> 0xc),CONCAT44(extraout_var,iVar4));
            }
            Abc_NtkUpdate(p->pObj,pObjNew,p->vLevels);
            break;
          }
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < p->nEvals);
      iVar5 = 1;
    }
  }
  return iVar5;
}

Assistant:

int Lpk_ResynthesizeNodeNew( Lpk_Man_t * p )
{
//    static int Count = 0;
    Abc_Obj_t * pObjNew, * pLeaf;
    Lpk_Cut_t * pCut;
    unsigned * pTruth;
    int nNodesBef, nNodesAft, nCutNodes;
    int i, k;
    abctime clk;
    int Required = Abc_ObjRequiredLevel(p->pObj);
//    CloudNode * pFun2;//, * pFun1;

    // compute the cuts
clk = Abc_Clock();
    if ( !Lpk_NodeCuts( p ) )
    {
p->timeCuts += Abc_Clock() - clk;
        return 0;
    }
p->timeCuts += Abc_Clock() - clk;

    if ( p->pPars->fVeryVerbose )
        printf( "Node %5d : Mffc size = %5d. Cuts = %5d.  Level = %2d. Req = %2d.\n", 
            p->pObj->Id, p->nMffc, p->nEvals, p->pObj->Level, Required );
    // try the good cuts
    p->nCutsTotal  += p->nCuts;
    p->nCutsUseful += p->nEvals;
    for ( i = 0; i < p->nEvals; i++ )
    {
        // get the cut
        pCut = p->pCuts + p->pEvals[i];
        if ( p->pPars->fFirst && i == 1 )
            break;
//        if ( pCut->Weight < 1.05 )
//            continue;

        // skip bad cuts        
//        printf( "Mffc size = %d.  ", Abc_NodeMffcLabel(p->pObj) );
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
            Abc_NtkObj(p->pNtk, pCut->pLeaves[k])->vFanouts.nSize++;
        nCutNodes = Abc_NodeMffcLabel(p->pObj);
//        printf( "Mffc with cut = %d.  ", nCutNodes );
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
            Abc_NtkObj(p->pNtk, pCut->pLeaves[k])->vFanouts.nSize--;
//        printf( "Mffc cut = %d.  ", (int)pCut->nNodes - (int)pCut->nNodesDup );
//        printf( "\n" );
        if ( nCutNodes != (int)pCut->nNodes - (int)pCut->nNodesDup )
            continue;

        // collect nodes into the array
        Vec_PtrClear( p->vLeaves );
        for ( k = 0; k < (int)pCut->nLeaves; k++ )
            Vec_PtrPush( p->vLeaves, Abc_NtkObj(p->pNtk, pCut->pLeaves[k]) );

        // compute the truth table
clk = Abc_Clock();
        pTruth = Lpk_CutTruth( p, pCut, 0 );
p->timeTruth += Abc_Clock() - clk;
clk = Abc_Clock();
        Lpk_ComputeSupports( p, pCut, pTruth );        
p->timeSupps += Abc_Clock() - clk;
//clk = Abc_Clock();
//        pFun1 = Lpk_CutTruthBdd( p, pCut );
//p->timeTruth2 += Abc_Clock() - clk;
/*
clk = Abc_Clock();
        Cloud_Restart( p->pDsdMan->dd );
        pFun2 = Kit_TruthToCloud( p->pDsdMan->dd, pTruth, pCut->nLeaves );
        RetValue = Kit_CreateCloud( p->pDsdMan->dd, pFun2, p->vBddNodes );
p->timeTruth3 += Abc_Clock() - clk;
*/
//        if ( pFun1 != pFun2 )
//            printf( "Truth tables do not agree!\n" );
//        else
//            printf( "Fine!\n" );

        if ( p->pPars->fVeryVerbose )
        {
//            char * pFileName;
            int nSuppSize = Extra_TruthSupportSize( pTruth, pCut->nLeaves );
            printf( "  C%02d: L= %2d/%2d  V= %2d/%d  N= %d  W= %4.2f  ", 
                i, pCut->nLeaves, nSuppSize, pCut->nNodes, pCut->nNodesDup, pCut->nLuts, pCut->Weight );
            Vec_PtrForEachEntry( Abc_Obj_t *, p->vLeaves, pLeaf, k )
                printf( "%c=%d ", 'a'+k, Abc_ObjLevel(pLeaf) );
            printf( "\n" );
            Kit_DsdPrintFromTruth( pTruth, pCut->nLeaves );
//            pFileName = Kit_TruthDumpToFile( pTruth, pCut->nLeaves, Count++ );
//            printf( "Saved truth table in file \"%s\".\n", pFileName );
        }

        // update the network
        nNodesBef = Abc_NtkNodeNum(p->pNtk);
clk = Abc_Clock();
        pObjNew = Lpk_Decompose( p, p->pNtk, p->vLeaves, pTruth, p->puSupps, p->pPars->nLutSize,
            (int)pCut->nNodes - (int)pCut->nNodesDup - 1 + (int)(p->pPars->fZeroCost > 0), Required );
p->timeEval += Abc_Clock() - clk;
        nNodesAft = Abc_NtkNodeNum(p->pNtk);

        // perform replacement
        if ( pObjNew )
        {
            int nGain = (int)pCut->nNodes - (int)pCut->nNodesDup - (nNodesAft - nNodesBef);
            assert( nGain >= 1 - p->pPars->fZeroCost );
            assert( Abc_ObjLevel(pObjNew) <= Required );
/*
            if ( nGain <= 0 )
            {
                int x = 0;
            }
            if ( Abc_ObjLevel(pObjNew) > Required )
            {
                int x = 0;
            }
*/
            p->nGainTotal += nGain;
            p->nChanges++;
            if ( p->pPars->fVeryVerbose )
                printf( "Performed resynthesis: Gain = %2d. Level = %2d. Req = %2d.\n", nGain, Abc_ObjLevel(pObjNew), Required );
            Abc_NtkUpdate( p->pObj, pObjNew, p->vLevels );
//printf( "%3d : %d-%d=%d(%d) \n", p->nChanges, nNodesBef, Abc_NtkNodeNum(p->pNtk), nNodesBef-Abc_NtkNodeNum(p->pNtk), nGain );
            break;
        }
    }
    return 1;
}